

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_file.hpp
# Opt level: O1

void __thiscall iutest::TempFile::Delete(TempFile *this)

{
  (*(this->super_IFile).super_IOutStream._vptr_IOutStream[4])();
  if ((this->m_filename)._M_string_length != 0) {
    remove((this->m_filename)._M_dataplus._M_p);
    std::__cxx11::string::_M_replace
              ((ulong)&this->m_filename,0,(char *)(this->m_filename)._M_string_length,0x128260);
    return;
  }
  return;
}

Assistant:

void Delete()
    {
        Close();
        if( !m_filename.empty() )
        {
            remove(m_filename.c_str());
            m_filename = "";
        }
    }